

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O2

rc_size __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  int iVar1;
  uint uVar2;
  rc_data *prVar3;
  ulong uVar4;
  longdouble lVar5;
  longdouble lVar6;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  _Head_base<0UL,_int_*,_false> local_60;
  int *local_58;
  unique_ptr<int[],_std::default_delete<int[]>_> local_50;
  longdouble local_48;
  longdouble local_3c;
  
  local_50._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)&this->ap;
  uVar4 = 0;
  uVar2 = 0;
  for (; begin != end; begin = begin + 1) {
    sparse_matrix<int>::column
              ((sparse_matrix<int> *)&local_60,
               (int)local_50._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl);
    lVar6 = (longdouble)0;
    lVar5 = lVar6;
    for (; local_58 != local_60._M_head_impl; local_58 = local_58 + 2) {
      local_48 = lVar5;
      local_3c = lVar6;
      iVar1 = value_bit_array<-1,_1>::get(&this->A,*local_58);
      lVar6 = (this->pi)._M_t.
              super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
              super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
              super__Head_base<0UL,_long_double_*,_false>._M_head_impl[local_58[1]] *
              (longdouble)iVar1 + local_3c;
      lVar5 = local_48 +
              (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
              ._M_t.super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
              super__Head_base<0UL,_long_double_*,_false>._M_head_impl[*local_58] *
              (longdouble)iVar1;
    }
    prVar3 = (this->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    prVar3[uVar4].id = (int)uVar4;
    prVar3[uVar4].value =
         ((this->c->linear_elements)._M_t.
          super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
          super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
          super__Head_base<0UL,_long_double_*,_false>._M_head_impl[begin->column] - lVar6) - lVar5;
    iVar1 = value_bit_array<-1,_1>::get(&this->A,begin->value);
    prVar3 = (this->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    prVar3[uVar4].f = iVar1;
    if (iVar1 < 0) {
      prVar3 = prVar3 + uVar4;
      prVar3->value = -prVar3->value;
      uVar2 = uVar2 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  return (rc_size)(uVar4 & 0xffffffff | (ulong)uVar2 << 0x20);
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A.get(std::get<0>(ht)->value));

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A.get(begin->value);

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }